

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  nk_rect bounds;
  nk_rect bounds_00;
  int iVar1;
  float fVar2;
  undefined8 uVar3;
  float local_e4;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  nk_rect button;
  float scroll_h;
  nk_flags ws;
  float scroll_ratio;
  float scroll_off;
  float scroll_offset;
  float scroll_step;
  nk_rect cursor;
  nk_rect empty_south;
  nk_rect empty_north;
  nk_user_font *font_local;
  nk_input *in_local;
  nk_style_scrollbar *style_local;
  float button_pixel_inc_local;
  float step_local;
  float target_local;
  float offset_local;
  int has_scrolling_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_18;
  nk_rect scroll_local;
  
  scroll_local._0_8_ = scroll._8_8_;
  uVar3 = scroll._0_8_;
  unique0x10000966 = uVar3;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5331,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style != (nk_style_scrollbar *)0x0) {
    if (state != (nk_flags *)0x0) {
      if ((out == (nk_command_buffer *)0x0) || (style == (nk_style_scrollbar *)0x0)) {
        scroll_local.w = 0.0;
      }
      else {
        scroll_local.x = scroll.w;
        if (1.0 <= scroll_local.x) {
          local_bc = scroll_local.x;
        }
        else {
          local_bc = 1.0;
        }
        scroll_local.y = scroll.h;
        if (0.0 <= scroll_local.y) {
          local_c0 = scroll_local.y;
        }
        else {
          local_c0 = 0.0;
        }
        scroll_local.x = local_bc;
        scroll_local.x = local_bc;
        scroll_local.y = local_c0;
        if (local_c0 < target) {
          step_local = offset;
          if (style->show_buttons != 0) {
            state_local._4_4_ = scroll.x;
            fVar2 = state_local._4_4_;
            button.x = local_bc;
            button.y = local_bc;
            if (0.0 <= local_c0 - (local_bc + local_bc)) {
              local_c4 = local_c0 - (local_bc + local_bc);
            }
            else {
              local_c4 = 0.0;
            }
            button.w = local_c4;
            local_c8 = button_pixel_inc;
            if (step < button_pixel_inc) {
              local_c8 = step;
            }
            bounds.w = local_bc;
            bounds.x = (float)(int)uVar3;
            bounds.y = (float)(int)((ulong)uVar3 >> 0x20);
            bounds.h = local_bc;
            iVar1 = nk_do_button_symbol((nk_flags *)&button.h,out,bounds,style->dec_symbol,
                                        NK_BUTTON_REPEATER,&style->dec_button,in,font);
            if (iVar1 != 0) {
              step_local = offset - local_c8;
            }
            bounds_00.y = (fStack_18 + scroll_local.y) - button.y;
            bounds_00.x = fVar2;
            bounds_00.w = button.x;
            bounds_00.h = button.y;
            iVar1 = nk_do_button_symbol((nk_flags *)&button.h,out,bounds_00,style->inc_symbol,
                                        NK_BUTTON_REPEATER,&style->inc_button,in,font);
            if (iVar1 != 0) {
              step_local = step_local + local_c8;
            }
            stack0xffffffffffffffe4 = CONCAT44(fStack_18 + button.y,state_local._4_4_);
            scroll_local.y = button.w;
          }
          local_cc = step;
          if (scroll_local.y <= step) {
            local_cc = scroll_local.y;
          }
          if (target - scroll_local.y <= step_local) {
            local_d0 = target - scroll_local.y;
          }
          else {
            local_d0 = step_local;
          }
          if (0.0 <= local_d0) {
            if (target - scroll_local.y <= step_local) {
              local_d8 = target - scroll_local.y;
            }
            else {
              local_d8 = step_local;
            }
            local_d4 = local_d8;
          }
          else {
            local_d4 = 0.0;
          }
          if (0.0 <= (scroll_local.y / target) * scroll_local.y +
                     -(style->border + style->border + (style->padding).y * 2.0)) {
            local_dc = (scroll_local.y / target) * scroll_local.y +
                       -(style->border + style->border + (style->padding).y * 2.0);
          }
          else {
            local_dc = 0.0;
          }
          cursor.y = local_dc;
          scroll_step = (local_d4 / target) * scroll_local.y + fStack_18 + style->border +
                        (style->padding).y;
          cursor.x = scroll_local.x - (style->border + style->border + (style->padding).x * 2.0);
          scroll_offset = state_local._4_4_ + style->border + (style->padding).x;
          empty_south.w = state_local._4_4_;
          empty_south.h = fStack_18;
          cursor.w = state_local._4_4_;
          cursor.h = scroll_step + local_dc;
          empty_south.x = scroll_local.x;
          if (0.0 <= (fStack_18 + scroll_local.y) - (scroll_step + local_dc)) {
            local_e4 = (fStack_18 + scroll_local.y) - (scroll_step + local_dc);
          }
          else {
            local_e4 = 0.0;
          }
          empty_south.y = local_e4;
          fVar2 = nk_scrollbar_behavior
                            (state,in,has_scrolling,(nk_rect *)((long)&state_local + 4),
                             (nk_rect *)&scroll_offset,(nk_rect *)&empty_south.w,
                             (nk_rect *)&cursor.w,local_d4,target,local_cc,NK_VERTICAL);
          scroll_step = (fVar2 / target) * scroll_local.y + fStack_18 + style->border_cursor +
                        (style->padding).y;
          if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
            (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
          }
          nk_draw_scrollbar(out,*state,style,(nk_rect *)((long)&state_local + 4),
                            (nk_rect *)&scroll_offset);
          scroll_local.w = fVar2;
          if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
            (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
          }
        }
        else {
          scroll_local.w = 0.0;
        }
      }
      return scroll_local.w;
    }
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5333,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  __assert_fail("style",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5332,
                "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect empty_north;
    struct nk_rect empty_south;
    struct nk_rect cursor;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    NK_ASSERT(state);
    if (!out || !style) return 0;

    scroll.w = NK_MAX(scroll.w, 1);
    scroll.h = NK_MAX(scroll.h, 0);
    if (target <= scroll.h) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_h;
        struct nk_rect button;

        button.x = scroll.x;
        button.w = scroll.w;
        button.h = scroll.w;

        scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.y = scroll.y;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.y = scroll.y + scroll.h - button.h;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.y = scroll.y + button.h;
        scroll.h = scroll_h;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.h);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
    scroll_ratio = scroll.h / target;
    scroll_off = scroll_offset / target;

    /* calculate scrollbar cursor bounds */
    cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
    cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
    cursor.x = scroll.x + style->border + style->padding.x;

    /* calculate empty space around cursor */
    empty_north.x = scroll.x;
    empty_north.y = scroll.y;
    empty_north.w = scroll.w;
    empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

    empty_south.x = scroll.x;
    empty_south.y = cursor.y + cursor.h;
    empty_south.w = scroll.w;
    empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
    scroll_off = scroll_offset / target;
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}